

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2FilterHandlers.cpp
# Opt level: O3

void __thiscall
SAX2SortAttributesFilter::startElement
          (SAX2SortAttributesFilter *this,XMLCh *uri,XMLCh *localname,XMLCh *qname,
          Attributes *attributes)

{
  wchar16 *pwVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Attr *pAVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ulong uVar5;
  XMLSize_t i;
  long lVar6;
  XMLSize_t XVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  BaseRefVectorOf<Attr> local_60;
  
  iVar3 = (*attributes->_vptr_Attributes[2])(attributes);
  XVar7 = CONCAT44(extraout_var,iVar3);
  local_60.fAdoptedElems = true;
  local_60.fCurCount = 0;
  local_60.fMemoryManager = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
  local_60.fMaxCount = XVar7;
  local_60.fElemList =
       (Attr **)(**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x18))
                          (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,XVar7 * 8);
  auVar2 = _DAT_00109020;
  if (XVar7 != 0) {
    lVar6 = XVar7 - 1;
    auVar8._8_4_ = (int)lVar6;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar5 = 0;
    auVar8 = auVar8 ^ _DAT_00109020;
    auVar9 = _DAT_00109010;
    do {
      auVar10 = auVar9 ^ auVar2;
      if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                  auVar8._4_4_ < auVar10._4_4_) & 1)) {
        local_60.fElemList[uVar5] = (Attr *)0x0;
      }
      if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
          auVar10._12_4_ <= auVar8._12_4_) {
        local_60.fElemList[uVar5 + 1] = (Attr *)0x0;
      }
      uVar5 = uVar5 + 2;
      lVar6 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar6 + 2;
    } while ((XVar7 + 1 & 0xfffffffffffffffe) != uVar5);
  }
  local_60._vptr_BaseRefVectorOf = (_func_int **)&PTR__AttrList_0010c7d8;
  uVar5 = 0;
  do {
    iVar3 = (*attributes->_vptr_Attributes[2])(attributes);
    if (CONCAT44(extraout_var_00,iVar3) <= uVar5) {
      xercesc_4_0::SAX2XMLFilterImpl::startElement
                ((wchar16 *)this,uri,localname,(Attributes *)qname);
      xercesc_4_0::RefVectorOf<Attr>::~RefVectorOf((RefVectorOf<Attr> *)&local_60);
      return;
    }
    if (local_60.fCurCount == 0) {
      XVar7 = 0;
    }
    else {
      XVar7 = 0;
      do {
        pAVar4 = xercesc_4_0::BaseRefVectorOf<Attr>::elementAt(&local_60,XVar7);
        pwVar1 = pAVar4->qName;
        iVar3 = (*attributes->_vptr_Attributes[5])(attributes,uVar5);
        iVar3 = xercesc_4_0::XMLString::compareString
                          (pwVar1,(wchar16 *)CONCAT44(extraout_var_01,iVar3));
        if (-1 < iVar3) break;
        XVar7 = XVar7 + 1;
      } while (XVar7 < local_60.fCurCount);
    }
    pAVar4 = (Attr *)operator_new(0x28);
    iVar3 = (*attributes->_vptr_Attributes[5])(attributes,uVar5);
    pAVar4->qName = (XMLCh *)CONCAT44(extraout_var_02,iVar3);
    iVar3 = (*attributes->_vptr_Attributes[3])(attributes,uVar5);
    pAVar4->uri = (XMLCh *)CONCAT44(extraout_var_03,iVar3);
    iVar3 = (*attributes->_vptr_Attributes[4])(attributes,uVar5);
    pAVar4->localPart = (XMLCh *)CONCAT44(extraout_var_04,iVar3);
    iVar3 = (*attributes->_vptr_Attributes[7])(attributes,uVar5);
    pAVar4->value = (XMLCh *)CONCAT44(extraout_var_05,iVar3);
    iVar3 = (*attributes->_vptr_Attributes[6])(attributes,uVar5);
    pAVar4->attrType = (XMLCh *)CONCAT44(extraout_var_06,iVar3);
    xercesc_4_0::BaseRefVectorOf<Attr>::insertElementAt(&local_60,pAVar4,XVar7);
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void SAX2SortAttributesFilter::startElement(const   XMLCh* const    uri,
                                            const   XMLCh* const    localname,
                                            const   XMLCh* const    qname,
                                            const   Attributes&		attributes)
{
    AttrList sortedList(attributes.getLength());
    for(XMLSize_t i=0;i<attributes.getLength();i++)
    {
        XMLSize_t j;
        for(j=0;j<sortedList.getLength();j++)
        {
            if(XMLString::compareString(sortedList.elementAt(j)->qName,attributes.getQName(i))>=0)
                break;
        }
        Attr* pClone=new Attr;
        pClone->qName       = attributes.getQName(i);
        pClone->uri         = attributes.getURI(i);
        pClone->localPart   = attributes.getLocalName(i);
        pClone->value       = attributes.getValue(i);
        pClone->attrType    = attributes.getType(i);
        sortedList.insertElementAt(pClone, j);
    }
    SAX2XMLFilterImpl::startElement(uri, localname, qname, sortedList);
}